

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
* __thiscall
diligent_spirv_cross::CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *__return_storage_ptr__,CompilerGLSL *this,SPIRType *basetype,uint32_t *indices,
          uint32_t count,uint32_t offset,uint32_t word_stride,bool *need_transpose,
          uint32_t *out_matrix_stride,uint32_t *out_array_stride,bool ptr_chain)

{
  ID id;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *ppVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SPIRConstant *pSVar6;
  SPIRType *pSVar7;
  CompilerError *pCVar8;
  ulong uVar9;
  SPIRType *local_d0;
  uint32_t local_c0;
  uint local_bc;
  string expr;
  Bitset local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_50;
  SPIRType *local_48;
  uint32_t *local_40;
  ulong local_38;
  
  local_48 = basetype;
  local_40 = indices;
  local_d0 = Compiler::get_pointee_type(&this->super_Compiler,basetype);
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  local_c0 = 0;
  if (need_transpose == (bool *)0x0) {
    bVar2 = 0;
  }
  else {
    bVar2 = *need_transpose;
  }
  if (out_matrix_stride != (uint32_t *)0x0) {
    local_c0 = *out_matrix_stride;
  }
  if (out_array_stride == (uint32_t *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *out_array_stride;
  }
  local_38 = (ulong)count;
  uVar9 = 0;
  local_bc = offset;
  local_50 = __return_storage_ptr__;
  do {
    ppVar1 = local_50;
    if (local_38 == uVar9) {
      if (need_transpose != (bool *)0x0) {
        *need_transpose = (bool)(bVar2 & 1);
      }
      if (out_matrix_stride != (uint32_t *)0x0) {
        *out_matrix_stride = local_c0;
      }
      if (out_array_stride != (uint32_t *)0x0) {
        *out_array_stride = uVar3;
      }
      ::std::__cxx11::string::string((string *)local_50,(string *)&expr);
      ppVar1->second = local_bc;
      ::std::__cxx11::string::~string((string *)&expr);
      return ppVar1;
    }
    uVar4 = local_40[uVar9];
    if (uVar9 == 0 && ptr_chain) {
      uVar3 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(local_48->super_IVariant).self.id,ArrayStride);
      if (uVar3 == 0) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar8,"SPIR-V does not define ArrayStride for buffer block.");
        goto LAB_0063fccc;
      }
      pSVar6 = Compiler::maybe_get<diligent_spirv_cross::SPIRConstant>(&this->super_Compiler,uVar4);
      pSVar7 = local_d0;
      if (pSVar6 == (SPIRConstant *)0x0) {
        if (uVar3 % word_stride != 0) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar8,
                     "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                    );
          __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_((string *)&local_90,this,uVar4,true);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::append((char *)&expr);
        ::std::__cxx11::to_string((string *)&local_90,uVar3 / word_stride);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::append((char *)&expr);
      }
      else {
        local_bc = local_bc + (pSVar6->m).c[0].r[0].u32 * uVar3;
      }
    }
    else if ((local_d0->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      if (local_d0->basetype == Struct) {
        uVar4 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar4);
        if ((local_d0->member_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size <= (ulong)uVar4) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Member index is out of bounds!");
LAB_0063fccc:
          __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar5 = Compiler::type_struct_member_offset(&this->super_Compiler,local_d0,uVar4);
        pSVar7 = Compiler::get<diligent_spirv_cross::SPIRType>
                           (&this->super_Compiler,
                            (local_d0->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                            .ptr[uVar4].id);
        if (pSVar7->columns < 2) {
          bVar2 = 0;
        }
        else {
          local_c0 = Compiler::type_struct_member_matrix_stride
                               (&this->super_Compiler,local_d0,uVar4);
          Compiler::combined_decoration_for_member(&local_90,&this->super_Compiler,local_d0,uVar4);
          bVar2 = (byte)local_90.lower >> 4;
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_90.higher._M_h);
        }
        local_bc = local_bc + uVar5;
        if ((pSVar7->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          uVar3 = Compiler::type_struct_member_array_stride(&this->super_Compiler,local_d0,uVar4);
        }
      }
      else if (local_d0->columns < 2) {
        if (local_d0->vecsize < 2) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Cannot subdivide a scalar value!");
          goto LAB_0063fccc;
        }
        pSVar6 = Compiler::maybe_get<diligent_spirv_cross::SPIRConstant>
                           (&this->super_Compiler,uVar4);
        if (pSVar6 == (SPIRConstant *)0x0) {
          uVar5 = local_c0;
          if ((bVar2 & 1) == 0) {
            uVar5 = local_d0->width >> 3;
          }
          if (uVar5 % word_stride != 0) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar8,
                       "Stride for dynamic vector indexing must be divisible by the size of a 4-component vector. This cannot be flattened in legacy targets."
                      );
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_((string *)&local_90,this,uVar4,false);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::append((char *)&expr);
          ::std::__cxx11::to_string((string *)&local_90,uVar5 / word_stride);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::append((char *)&expr);
        }
        else {
          uVar5 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar4);
          uVar4 = local_c0;
          if ((bVar2 & 1) == 0) {
            uVar4 = local_d0->width >> 3;
          }
          local_bc = local_bc + uVar4 * uVar5;
        }
        pSVar7 = Compiler::get<diligent_spirv_cross::SPIRType>
                           (&this->super_Compiler,(local_d0->parent_type).id);
      }
      else {
        pSVar6 = Compiler::maybe_get<diligent_spirv_cross::SPIRConstant>
                           (&this->super_Compiler,uVar4);
        if (pSVar6 == (SPIRConstant *)0x0) {
          uVar5 = local_c0;
          if ((bVar2 & 1) != 0) {
            uVar5 = local_d0->width >> 3;
          }
          if (uVar5 % word_stride != 0) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar8,
                       "Matrix stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a row-major matrix being accessed dynamically. This cannot be flattened. Try using std140 layout instead."
                      );
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_((string *)&local_90,this,uVar4,false);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::append((char *)&expr);
          ::std::__cxx11::to_string((string *)&local_90,uVar5 / word_stride);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::append((char *)&expr);
        }
        else {
          uVar5 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar4);
          uVar4 = local_c0;
          if ((bVar2 & 1) != 0) {
            uVar4 = local_d0->width >> 3;
          }
          local_bc = local_bc + uVar4 * uVar5;
        }
        pSVar7 = Compiler::get<diligent_spirv_cross::SPIRType>
                           (&this->super_Compiler,(local_d0->parent_type).id);
      }
    }
    else {
      pSVar6 = Compiler::maybe_get<diligent_spirv_cross::SPIRConstant>(&this->super_Compiler,uVar4);
      if (pSVar6 == (SPIRConstant *)0x0) {
        if (uVar3 % word_stride != 0) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar8,
                     "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                    );
          __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_((string *)&local_90,this,uVar4,false);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::append((char *)&expr);
        ::std::__cxx11::to_string((string *)&local_90,uVar3 / word_stride);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::append((char *)&expr);
      }
      else {
        local_bc = local_bc + (pSVar6->m).c[0].r[0].u32 * uVar3;
      }
      id.id = (local_d0->parent_type).id;
      pSVar7 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,id.id);
      if ((pSVar7->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        uVar3 = Compiler::get_decoration(&this->super_Compiler,id,ArrayStride);
      }
    }
    local_d0 = pSVar7;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

std::pair<std::string, uint32_t> CompilerGLSL::flattened_access_chain_offset(
    const SPIRType &basetype, const uint32_t *indices, uint32_t count, uint32_t offset, uint32_t word_stride,
    bool *need_transpose, uint32_t *out_matrix_stride, uint32_t *out_array_stride, bool ptr_chain)
{
	// Start traversing type hierarchy at the proper non-pointer types.
	const auto *type = &get_pointee_type(basetype);

	std::string expr;

	// Inherit matrix information in case we are access chaining a vector which might have come from a row major layout.
	bool row_major_matrix_needs_conversion = need_transpose ? *need_transpose : false;
	uint32_t matrix_stride = out_matrix_stride ? *out_matrix_stride : 0;
	uint32_t array_stride = out_array_stride ? *out_array_stride : 0;

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		// Pointers
		if (ptr_chain && i == 0)
		{
			// Here, the pointer type will be decorated with an array stride.
			array_stride = get_decoration(basetype.self, DecorationArrayStride);
			if (!array_stride)
				SPIRV_CROSS_THROW("SPIR-V does not define ArrayStride for buffer block.");

			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}
		}
		// Arrays
		else if (!type->array.empty())
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}

			uint32_t parent_type = type->parent_type;
			type = &get<SPIRType>(parent_type);

			if (!type->array.empty())
				array_stride = get_decoration(parent_type, DecorationArrayStride);
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			offset += type_struct_member_offset(*type, index);

			auto &struct_type = *type;
			type = &get<SPIRType>(type->member_types[index]);

			if (type->columns > 1)
			{
				matrix_stride = type_struct_member_matrix_stride(struct_type, index);
				row_major_matrix_needs_conversion =
				    combined_decoration_for_member(struct_type, index).get(DecorationRowMajor);
			}
			else
				row_major_matrix_needs_conversion = false;

			if (!type->array.empty())
				array_stride = type_struct_member_array_stride(struct_type, index);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride);
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride;
				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Matrix stride for dynamic indexing must be divisible by the size of a "
					                  "4-component vector. "
					                  "Likely culprit here is a row-major matrix being accessed dynamically. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8));
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8);

				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Stride for dynamic vector indexing must be divisible by the "
					                  "size of a 4-component vector. "
					                  "This cannot be flattened in legacy targets.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		else
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (need_transpose)
		*need_transpose = row_major_matrix_needs_conversion;
	if (out_matrix_stride)
		*out_matrix_stride = matrix_stride;
	if (out_array_stride)
		*out_array_stride = array_stride;

	return std::make_pair(expr, offset);
}